

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int resolveOrderGroupBy(NameContext *pNC,Select *pSelect,ExprList *pOrderBy,char *zType)

{
  int mx;
  Parse *pParse_00;
  sqlite3 *pExpr;
  int iVar1;
  Expr *pE_00;
  u8 *local_70;
  Window **pp;
  Expr *pE2;
  Expr *pE;
  int nResult;
  Parse *pParse;
  ExprList_item *pItem;
  int local_38;
  int iCol;
  int j;
  int i;
  char *zType_local;
  ExprList *pOrderBy_local;
  Select *pSelect_local;
  NameContext *pNC_local;
  
  if (pOrderBy == (ExprList *)0x0) {
    pNC_local._4_4_ = 0;
  }
  else {
    mx = pSelect->pEList->nExpr;
    pParse_00 = pNC->pParse;
    pParse = (Parse *)pOrderBy->a;
    _j = zType;
    zType_local = (char *)pOrderBy;
    pOrderBy_local = (ExprList *)pSelect;
    pSelect_local = (Select *)pNC;
    for (iCol = 0; iCol < *(int *)zType_local; iCol = iCol + 1) {
      pExpr = pParse->db;
      pE_00 = sqlite3ExprSkipCollate((Expr *)pExpr);
      if ((*_j == 'G') ||
         (pItem._4_4_ = resolveAsName(pParse_00,*(ExprList **)pOrderBy_local,pE_00), pItem._4_4_ < 1
         )) {
        iVar1 = sqlite3ExprIsInteger(pE_00,(int *)((long)&pItem + 4));
        if (iVar1 == 0) {
          pParse->colNamesSet = '\0';
          pParse->checkSchema = '\0';
          iVar1 = sqlite3ResolveExprNames((NameContext *)pSelect_local,(Expr *)pExpr);
          if (iVar1 != 0) {
            return 1;
          }
          for (local_38 = 0; local_38 < **(int **)pOrderBy_local; local_38 = local_38 + 1) {
            iVar1 = sqlite3ExprCompare((Parse *)0x0,(Expr *)pExpr,
                                       *(Expr **)(*(long *)pOrderBy_local + 8 +
                                                 (long)local_38 * 0x20),-1);
            if (iVar1 == 0) {
              if (((ulong)pExpr->pVfs & 0x100000000000000) != 0) {
                for (local_70 = &pOrderBy_local[2].a[0].sortOrder; *(long *)local_70 != 0;
                    local_70 = (u8 *)(*(long *)local_70 + 0x30)) {
                  if (*(Table **)local_70 == ((anon_union_8_2_31fbcc88_for_y *)&pExpr->szMmap)->pTab
                     ) {
                    *(long *)local_70 = *(long *)(*(long *)local_70 + 0x30);
                  }
                }
              }
              *(short *)&pParse->colNamesSet = (short)local_38 + 1;
            }
          }
        }
        else {
          if ((pItem._4_4_ < 1) || (0xffff < pItem._4_4_)) {
            resolveOutOfRangeError(pParse_00,_j,iCol + 1,mx);
            return 1;
          }
          pParse->colNamesSet = (char)(short)pItem._4_4_;
          pParse->checkSchema = (char)((ushort)(short)pItem._4_4_ >> 8);
        }
      }
      else {
        pParse->colNamesSet = (char)(short)pItem._4_4_;
        pParse->checkSchema = (char)((ushort)(short)pItem._4_4_ >> 8);
      }
      pParse = (Parse *)&pParse->isMultiWrite;
    }
    pNC_local._4_4_ =
         sqlite3ResolveOrderGroupBy(pParse_00,(Select *)pOrderBy_local,(ExprList *)zType_local,_j);
  }
  return pNC_local._4_4_;
}

Assistant:

static int resolveOrderGroupBy(
  NameContext *pNC,     /* The name context of the SELECT statement */
  Select *pSelect,      /* The SELECT statement holding pOrderBy */
  ExprList *pOrderBy,   /* An ORDER BY or GROUP BY clause to resolve */
  const char *zType     /* Either "ORDER" or "GROUP", as appropriate */
){
  int i, j;                      /* Loop counters */
  int iCol;                      /* Column number */
  struct ExprList_item *pItem;   /* A term of the ORDER BY clause */
  Parse *pParse;                 /* Parsing context */
  int nResult;                   /* Number of terms in the result set */

  if( pOrderBy==0 ) return 0;
  nResult = pSelect->pEList->nExpr;
  pParse = pNC->pParse;
  for(i=0, pItem=pOrderBy->a; i<pOrderBy->nExpr; i++, pItem++){
    Expr *pE = pItem->pExpr;
    Expr *pE2 = sqlite3ExprSkipCollate(pE);
    if( zType[0]!='G' ){
      iCol = resolveAsName(pParse, pSelect->pEList, pE2);
      if( iCol>0 ){
        /* If an AS-name match is found, mark this ORDER BY column as being
        ** a copy of the iCol-th result-set column.  The subsequent call to
        ** sqlite3ResolveOrderGroupBy() will convert the expression to a
        ** copy of the iCol-th result-set expression. */
        pItem->u.x.iOrderByCol = (u16)iCol;
        continue;
      }
    }
    if( sqlite3ExprIsInteger(pE2, &iCol) ){
      /* The ORDER BY term is an integer constant.  Again, set the column
      ** number so that sqlite3ResolveOrderGroupBy() will convert the
      ** order-by term to a copy of the result-set expression */
      if( iCol<1 || iCol>0xffff ){
        resolveOutOfRangeError(pParse, zType, i+1, nResult);
        return 1;
      }
      pItem->u.x.iOrderByCol = (u16)iCol;
      continue;
    }

    /* Otherwise, treat the ORDER BY term as an ordinary expression */
    pItem->u.x.iOrderByCol = 0;
    if( sqlite3ResolveExprNames(pNC, pE) ){
      return 1;
    }
    for(j=0; j<pSelect->pEList->nExpr; j++){
      if( sqlite3ExprCompare(0, pE, pSelect->pEList->a[j].pExpr, -1)==0 ){
#ifndef SQLITE_OMIT_WINDOWFUNC
        if( ExprHasProperty(pE, EP_WinFunc) ){
          /* Since this window function is being changed into a reference
          ** to the same window function the result set, remove the instance
          ** of this window function from the Select.pWin list. */
          Window **pp;
          for(pp=&pSelect->pWin; *pp; pp=&(*pp)->pNextWin){
            if( *pp==pE->y.pWin ){
              *pp = (*pp)->pNextWin;
            }    
          }
        }
#endif
        pItem->u.x.iOrderByCol = j+1;
      }
    }
  }
  return sqlite3ResolveOrderGroupBy(pParse, pSelect, pOrderBy, zType);
}